

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int TestXmmXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86XmmReg_x86XmmReg *fun)

{
  x86XmmReg reg1;
  x86XmmReg reg2;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  int local_48;
  
  lVar3 = 0;
  puVar2 = stream;
  do {
    reg1 = testXmmRegs[lVar3];
    lVar4 = 0;
    do {
      reg2 = *(x86XmmReg *)((long)testXmmRegs + lVar4);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar2,reg1,reg2);
      puVar2 = puVar2 + iVar1;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x18);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  local_48 = (int)stream;
  return (int)puVar2 - local_48;
}

Assistant:

int TestXmmXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86XmmReg dst, x86XmmReg src))
{
	unsigned char *start = stream;

	for(unsigned xmm1 = 0; xmm1 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm1++)
	{
		for(unsigned xmm2 = 0; xmm2 < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm2++)
		{
			EMIT_OP_REG_REG(ctx, op, testXmmRegs[xmm1], testXmmRegs[xmm2]);
			stream += fun(stream, testXmmRegs[xmm1], testXmmRegs[xmm2]);
		}
	}

	return int(stream - start);
}